

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

void __thiscall
wasm::
Walker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
::walkFunctionInModule
          (Walker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
           *this,Function *func,Module *module)

{
  Expression *pEVar1;
  Signature SVar2;
  
  this->currModule = module;
  this->currFunction = func;
  walk(this,&func->body);
  pEVar1 = func->body;
  if (pEVar1 != (Expression *)0x0) {
    SVar2 = HeapType::getSignature(&func->type);
    anon_unknown_22::Unsubtyping::noteSubtype
              ((Unsubtyping *)(this[-1].stack.fixed._M_elems + 7),(Type)(pEVar1->type).id,
               SVar2.results.id);
  }
  this->currFunction = (Function *)0x0;
  this->currModule = (Module *)0x0;
  return;
}

Assistant:

void walkFunctionInModule(Function* func, Module* module) {
    setModule(module);
    setFunction(func);
    static_cast<SubType*>(this)->doWalkFunction(func);
    static_cast<SubType*>(this)->visitFunction(func);
    setFunction(nullptr);
    setModule(nullptr);
  }